

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.h
# Opt level: O3

void __thiscall CConnman::ForEachNode(CConnman *this,NodeFn *func)

{
  pointer ppCVar1;
  bool bVar2;
  undefined8 uVar3;
  pointer ppCVar4;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock9;
  CNode *local_40;
  unique_lock<std::recursive_mutex> local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._M_device = &(this->m_nodes_mutex).super_recursive_mutex;
  local_38._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_38);
  ppCVar4 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppCVar1 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar4 != ppCVar1) {
    do {
      bVar2 = NodeFullyConnected(*ppCVar4);
      if (bVar2) {
        local_40 = *ppCVar4;
        if ((func->super__Function_base)._M_manager == (_Manager_type)0x0) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
            uVar3 = std::__throw_bad_function_call();
            std::unique_lock<std::recursive_mutex>::~unique_lock(&local_38);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
              _Unwind_Resume(uVar3);
            }
          }
          goto LAB_008f65e6;
        }
        (*func->_M_invoker)((_Any_data *)func,&local_40);
      }
      ppCVar4 = ppCVar4 + 1;
    } while (ppCVar4 != ppCVar1);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_008f65e6:
  __stack_chk_fail();
}

Assistant:

void ForEachNode(const NodeFn& func)
    {
        LOCK(m_nodes_mutex);
        for (auto&& node : m_nodes) {
            if (NodeFullyConnected(node))
                func(node);
        }
    }